

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_frac_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  bool bVar1;
  error_category *peVar2;
  error_code err;
  
  if (c == '.') {
    (this->super_matcher<pstore::json::null_output>).state_ = 6;
  }
  else {
    if ((c & 0xdfU) != 0x45) {
      if (9 < (byte)(c - 0x30U)) {
        (this->super_matcher<pstore::json::null_output>).state_ = 1;
        make_result(this,parser);
        return false;
      }
      peVar2 = get_error_category();
      err._M_cat = peVar2;
      err._0_8_ = 6;
      bVar1 = parser<pstore::json::null_output>::set_error(parser,err);
      if (!bVar1) {
        return true;
      }
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
      return true;
    }
    (this->super_matcher<pstore::json::null_output>).state_ = 8;
  }
  return true;
}

Assistant:

bool number_matcher<Callbacks>::do_frac_state (parser<Callbacks> & parser,
                                                           char const c) {
                bool match = true;
                if (c == '.') {
                    this->set_state (frac_initial_digit_state);
                } else if (c == 'e' || c == 'E') {
                    this->set_state (exponent_sign_state);
                } else if (c >= '0' && c <= '9') {
                    // digits are definitely not part of the next token so we can issue an error
                    // right here.
                    this->set_error (parser, error_code::number_out_of_range);
                } else {
                    // the 'frac' production is optional.
                    match = false;
                    this->complete (parser);
                }
                return match;
            }